

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O2

string * cmQtAutoGeneratorCommon::Quoted(string *__return_storage_ptr__,string *text)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  for (lVar1 = 8; lVar1 != 0x98; lVar1 = lVar1 + 0x10) {
    cmsys::SystemTools::ReplaceString
              (__return_storage_ptr__,*(char **)(&UNK_0064e678 + lVar1),
               *(char **)((long)Quoted::rep + lVar1));
  }
  std::operator+(&bStack_38,'\"',__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorCommon::Quoted(const std::string& text)
{
  static const char* rep[18] = { "\\", "\\\\", "\"", "\\\"", "\a", "\\a",
                                 "\b", "\\b",  "\f", "\\f",  "\n", "\\n",
                                 "\r", "\\r",  "\t", "\\t",  "\v", "\\v" };

  std::string res = text;
  for (const char* const* it = cmArrayBegin(rep); it != cmArrayEnd(rep);
       it += 2) {
    cmSystemTools::ReplaceString(res, *it, *(it + 1));
  }
  res = '"' + res;
  res += '"';
  return res;
}